

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::Square(Bignum *this)

{
  short sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Bignum *pBVar6;
  ulong uVar7;
  uint uVar8;
  Chunk *pCVar9;
  long lVar10;
  long lVar11;
  Chunk *pCVar12;
  
  sVar1 = this->used_bigits_;
  uVar8 = (uint)sVar1;
  if (0x40 < (int)uVar8) {
    abort();
  }
  uVar3 = (ulong)(int)uVar8;
  uVar2 = uVar3 * 2;
  uVar4 = (ulong)uVar8;
  if (0 < sVar1) {
    pCVar9 = this->bigits_buffer_ + uVar4;
    uVar7 = 0;
    do {
      pCVar9[uVar7] = this->bigits_buffer_[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
    if (0 < sVar1) {
      lVar10 = 1;
      uVar5 = 0;
      uVar7 = 0;
      pCVar12 = pCVar9;
      lVar11 = lVar10;
      do {
        do {
          uVar7 = uVar7 + (ulong)*pCVar12 * (ulong)this->bigits_buffer_[uVar3 + lVar10 + -1];
          lVar10 = lVar10 + -1;
          pCVar12 = pCVar12 + 1;
        } while (lVar10 != 0);
        this->bigits_buffer_[uVar5] = (uint)uVar7 & 0xfffffff;
        uVar7 = uVar7 >> 0x1c;
        uVar5 = uVar5 + 1;
        lVar10 = lVar11 + 1;
        pCVar12 = pCVar9;
        lVar11 = lVar10;
      } while (uVar5 != uVar4);
      goto LAB_003dbb24;
    }
  }
  uVar7 = 0;
LAB_003dbb24:
  if ((int)uVar8 < (int)uVar2) {
    lVar11 = uVar3 * 2;
    lVar10 = uVar3 * 2;
    pCVar9 = this->bigits_buffer_ + uVar3 + 1;
    do {
      uVar4 = uVar4 - 1;
      if ((long)uVar3 < lVar11 + -1) {
        uVar5 = 0;
        pBVar6 = (Bignum *)(this->bigits_buffer_ + lVar10 + -1);
        do {
          uVar8._0_2_ = pBVar6->used_bigits_;
          uVar8._2_2_ = pBVar6->exponent_;
          uVar7 = uVar7 + (ulong)pCVar9[uVar5] * (ulong)uVar8;
          pBVar6 = (Bignum *)((long)(pBVar6 + 0xffffffffffffffff) + 0x200);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      this->bigits_buffer_[uVar3] = (uint)uVar7 & 0xfffffff;
      uVar7 = uVar7 >> 0x1c;
      uVar3 = uVar3 + 1;
      pCVar9 = pCVar9 + 1;
    } while (uVar3 != uVar2);
  }
  sVar1 = (short)uVar2;
  this->used_bigits_ = sVar1;
  this->exponent_ = this->exponent_ << 1;
  if (sVar1 < 1) {
    if (sVar1 != 0) {
      return;
    }
  }
  else {
    do {
      sVar1 = (short)uVar2;
      if (this->bigits_buffer_[((uint)uVar2 & 0xffff) - 1] != 0) {
        return;
      }
      uVar8 = (uint)uVar2 - 1;
      this->used_bigits_ = (int16_t)uVar8;
      uVar2 = (ulong)uVar8;
    } while (1 < sVar1);
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::Square() {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  const int product_length = 2 * used_bigits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_bigits_) {
    DOUBLE_CONVERSION_UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  const int copy_offset = used_bigits_;
  for (int i = 0; i < used_bigits_; ++i) {
    RawBigit(copy_offset + i) = RawBigit(i);
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_bigits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      const Chunk chunk1 = RawBigit(copy_offset + bigit_index1);
      const Chunk chunk2 = RawBigit(copy_offset + bigit_index2);
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    RawBigit(i) = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_bigits_; i < product_length; ++i) {
    int bigit_index1 = used_bigits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_bigits_) {
      const Chunk chunk1 = RawBigit(copy_offset + bigit_index1);
      const Chunk chunk2 = RawBigit(copy_offset + bigit_index2);
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten RawBigit(i) will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_bigits_.
    RawBigit(i) = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  DOUBLE_CONVERSION_ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_bigits_ = static_cast<int16_t>(product_length);
  exponent_ *= 2;
  Clamp();
}